

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall
CRenderTools::RenderTee
          (CRenderTools *this,CAnimState *pAnim,CTeeRenderInfo *pInfo,int Emote,vec2 Dir,vec2 Pos)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_88;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_84;
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (pInfo->m_BotTexture).m_Id;
  bVar14 = iVar6 < 0;
  lVar8 = 0x24;
  if (bVar14) {
    lVar8 = 0x84;
  }
  lVar9 = 0x28;
  if (bVar14) {
    lVar9 = 0x88;
  }
  lVar10 = 0x2c;
  if (bVar14) {
    lVar10 = 0x8c;
  }
  lVar11 = 0x30;
  if (bVar14) {
    lVar11 = 0x90;
  }
  iVar7 = 0;
  do {
    if (iVar7 == 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
      fVar1 = pInfo->m_Size;
      fVar15 = fVar1 * 0.015625;
      local_88 = Pos.field_0;
      aStack_84 = Pos.field_1;
      if (iVar12 == 1) {
        uVar2 = (pAnim->m_Body).m_X;
        uVar4 = (pAnim->m_Body).m_Y;
        fVar18 = (float)uVar2 * fVar15 + local_88.x;
        fVar19 = (float)uVar4 * fVar15 + aStack_84.y;
        if (-1 < iVar6 && iVar7 != 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          SelectSprite(this,0x5b,0,0,0);
          fVar16 = fVar15 * 0.6666667 + fVar18;
          fVar17 = fVar15 * -15.333333 + fVar19;
          local_48 = CONCAT44(fVar17,fVar16);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)(pInfo->m_BotTexture).m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          SelectSprite(this,0x5a,0,0,0);
          local_48 = CONCAT44(fVar17,fVar16);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    ((pInfo->m_BotColor).field_0.x,(pInfo->m_BotColor).field_1.y,
                     (pInfo->m_BotColor).field_2.z,(pInfo->m_BotColor).field_3.w);
          SelectSprite(this,0x59,0,0,0);
          local_48 = CONCAT44(fVar17,fVar16);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        if (-1 < pInfo->m_aTextures[2].m_Id) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[2].field_0.x,pInfo->m_aColors[2].field_1.y,
                     pInfo->m_aColors[2].field_2.z,pInfo->m_aColors[2].field_3.w);
          SelectSprite(this,iVar7 == 0 | 0x4a,0,0,0);
          local_48 = CONCAT44(fVar19,fVar18);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
        if (iVar7 == 0) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          iVar13 = 0x45;
        }
        else {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[0].field_0.x,pInfo->m_aColors[0].field_1.y,
                     pInfo->m_aColors[0].field_2.z,pInfo->m_aColors[0].field_3.w);
          iVar13 = 0x46;
        }
        SelectSprite(this,iVar13,0,0,0);
        local_48 = CONCAT44(fVar19,fVar18);
        local_40 = fVar1;
        local_3c = fVar1;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                  (this->m_pGraphics,&local_48,1);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if (pInfo->m_aTextures[1].m_Id < 0 || iVar7 == 0) {
          if (iVar7 != 0) goto LAB_0017c32a;
        }
        else {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
          fVar16 = pInfo->m_aColors[1].field_3.w;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (pInfo->m_aColors[1].field_0.x * fVar16,pInfo->m_aColors[1].field_1.y * fVar16,
                     pInfo->m_aColors[1].field_2.z * fVar16);
          SelectSprite(this,0x49,0,0,0);
          local_48 = CONCAT44(fVar19,fVar18);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
LAB_0017c32a:
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                    (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[0].m_Id);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          iVar13 = 2;
          while (iVar13 != 0) {
            SelectSprite(this,(iVar13 != 2) + 0x47,0,0,0);
            local_48 = CONCAT44(fVar19,fVar18);
            local_40 = fVar1;
            local_3c = fVar1;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                      (this->m_pGraphics,&local_48,1);
            iVar13 = iVar13 + -1;
          }
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[5].m_Id);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
        fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
        if (-1 < iVar6) {
          Emote = 3;
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (*(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar8),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar9),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar10),
                   *(undefined4 *)((long)&pInfo->m_aTextures[0].m_Id + lVar11));
        if (iVar7 == 1) {
          iVar13 = 0x50;
          if (Emote - 1U < 4) {
            iVar13 = *(int *)(&DAT_001cd690 + (ulong)(Emote - 1U) * 4);
          }
          SelectSprite(this,iVar13,0,0,0);
          local_50 = fVar1 * 0.6;
          local_4c = fVar1 * 0.15;
          if (Emote != 5) {
            local_4c = local_50;
          }
          local_4c = local_4c * 0.5;
          local_58 = CONCAT44(fVar1 * (Dir.field_1.y * 0.1 + -0.05) + fVar19,
                              fVar1 * Dir.field_0.x * 0.125 + fVar18);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_58,1);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        if ((iVar7 != 0) && (-1 < (pInfo->m_HatTexture).m_Id)) {
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
          fVar16 = (pAnim->m_Body).m_Angle * 3.1415927;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar16 + fVar16);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                    (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
          if ((uint)pInfo->m_HatSpriteIndex < 4) {
            SelectSprite(this,pInfo->m_HatSpriteIndex + 0x55,(uint)(Dir.field_0.x < 0.0) * 2,0,0);
          }
          local_48 = CONCAT44(fVar19,fVar18);
          local_40 = fVar1;
          local_3c = fVar1;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])
                    (this->m_pGraphics,&local_48,1);
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
        }
      }
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                (this->m_pGraphics,(ulong)(uint)pInfo->m_aTextures[4].m_Id);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
      fVar18 = (&pAnim->m_BackFoot)[iVar12 != 0].m_Angle * 3.1415927;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(fVar18 + fVar18);
      if (iVar7 == 0) {
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        iVar13 = 0x4f;
      }
      else {
        fVar18 = 1.0;
        if (pInfo->m_GotAirJump == 0) {
          fVar18 = *(float *)(&DAT_001c9a14 +
                             (ulong)(this->m_pConfig->m_ClAirjumpindicator == 0) * 4);
        }
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  (pInfo->m_aColors[4].field_0.x * fVar18,pInfo->m_aColors[4].field_1.y * fVar18,
                   fVar18 * pInfo->m_aColors[4].field_2.z,pInfo->m_aColors[4].field_3.w);
        iVar13 = 0x4e;
      }
      SelectSprite(this,iVar13,0,0,0);
      uVar3 = (&pAnim->m_BackFoot)[iVar12 != 0].m_X;
      uVar5 = (&pAnim->m_BackFoot)[iVar12 != 0].m_Y;
      local_48 = CONCAT44(fVar15 * (float)uVar5 + aStack_84.y,fVar15 * (float)uVar3 + local_88.x);
      local_40 = fVar1 / 2.1;
      local_3c = fVar1 / 2.1;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1)
      ;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void CRenderTools::RenderTee(CAnimState *pAnim, const CTeeRenderInfo *pInfo, int Emote, vec2 Dir, vec2 Pos)
{
	vec2 Direction = Dir;
	vec2 Position = Pos;
	bool IsBot = pInfo->m_BotTexture.IsValid();

	// first pass we draw the outline
	// second pass we draw the filling
	for(int p = 0; p < 2; p++)
	{
		bool OutLine = p==0;

		for(int f = 0; f < 2; f++)
		{
			float AnimScale = pInfo->m_Size * 1.0f/64.0f;
			float BaseSize = pInfo->m_Size;
			if(f == 1)
			{
				vec2 BodyPos = Position + vec2(pAnim->GetBody()->m_X, pAnim->GetBody()->m_Y)*AnimScale;
				IGraphics::CQuadItem BodyItem(BodyPos.x, BodyPos.y, BaseSize, BaseSize);
				IGraphics::CQuadItem BotItem(BodyPos.x+(2.f/3.f)*AnimScale, BodyPos.y+(-16+2.f/3.f)*AnimScale, BaseSize, BaseSize); // x+0.66, y+0.66 to correct some rendering bug
				IGraphics::CQuadItem Item;

				// draw bot visuals (background)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_BACKGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw bot visuals (foreground)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_FOREGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					SelectSprite(SPRITE_TEE_BOT_GLOW, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw decoration
				if(pInfo->m_aTextures[SKINPART_DECORATION].IsValid())
				{
					Graphics()->TextureSet(pInfo->m_aTextures[2]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_DECORATION].r, pInfo->m_aColors[SKINPART_DECORATION].g, pInfo->m_aColors[SKINPART_DECORATION].b, pInfo->m_aColors[SKINPART_DECORATION].a);
					SelectSprite(OutLine?SPRITE_TEE_DECORATION_OUTLINE:SPRITE_TEE_DECORATION, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (behind marking)
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(OutLine)
				{
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BODY_OUTLINE, 0, 0, 0);
				}
				else
				{
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_BODY].r, pInfo->m_aColors[SKINPART_BODY].g, pInfo->m_aColors[SKINPART_BODY].b, pInfo->m_aColors[SKINPART_BODY].a);
					SelectSprite(SPRITE_TEE_BODY, 0, 0, 0);
				}
				Item = BodyItem;
				Graphics()->QuadsDraw(&Item, 1);
				Graphics()->QuadsEnd();

				// draw marking
				if(pInfo->m_aTextures[SKINPART_MARKING].IsValid() && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_MARKING]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_MARKING].r*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].g*pInfo->m_aColors[SKINPART_MARKING].a,
						pInfo->m_aColors[SKINPART_MARKING].b*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].a);
					SelectSprite(SPRITE_TEE_MARKING, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (in front of marking)
				if(!OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					for(int t = 0; t < 2; t++)
					{
						SelectSprite(t==0?SPRITE_TEE_BODY_SHADOW:SPRITE_TEE_BODY_UPPER_OUTLINE, 0, 0, 0);
						Item = BodyItem;
						Graphics()->QuadsDraw(&Item, 1);
					}
					Graphics()->QuadsEnd();
				}

				// draw eyes
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_EYES]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(IsBot)
				{
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					Emote = EMOTE_SURPRISE;
				}
				else
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_EYES].r, pInfo->m_aColors[SKINPART_EYES].g, pInfo->m_aColors[SKINPART_EYES].b, pInfo->m_aColors[SKINPART_EYES].a);
				if(p == 1)
				{
					switch (Emote)
					{
						case EMOTE_PAIN:
							SelectSprite(SPRITE_TEE_EYES_PAIN, 0, 0, 0);
							break;
						case EMOTE_HAPPY:
							SelectSprite(SPRITE_TEE_EYES_HAPPY, 0, 0, 0);
							break;
						case EMOTE_SURPRISE:
							SelectSprite(SPRITE_TEE_EYES_SURPRISE, 0, 0, 0);
							break;
						case EMOTE_ANGRY:
							SelectSprite(SPRITE_TEE_EYES_ANGRY, 0, 0, 0);
							break;
						default:
							SelectSprite(SPRITE_TEE_EYES_NORMAL, 0, 0, 0);
							break;
					}

					float EyeScale = BaseSize*0.60f;
					float h = Emote == EMOTE_BLINK ? BaseSize*0.15f/2.0f : EyeScale/2.0f;
					vec2 Offset = vec2(Direction.x*0.125f, -0.05f+Direction.y*0.10f)*BaseSize;
					IGraphics::CQuadItem QuadItem(BodyPos.x+Offset.x, BodyPos.y+Offset.y, EyeScale, h);
					Graphics()->QuadsDraw(&QuadItem, 1);
				}
				Graphics()->QuadsEnd();
				
				// draw xmas hat
				if(!OutLine && pInfo->m_HatTexture.IsValid())
				{
					Graphics()->TextureSet(pInfo->m_HatTexture);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi * 2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					int Flag = Direction.x < 0.0f ? SPRITE_FLAG_FLIP_X : 0;
					switch(pInfo->m_HatSpriteIndex)
					{
					case 0:
						SelectSprite(SPRITE_TEE_HATS_TOP1, Flag, 0, 0);
						break;
					case 1:
						SelectSprite(SPRITE_TEE_HATS_TOP2, Flag, 0, 0);
						break;
					case 2:
						SelectSprite(SPRITE_TEE_HATS_SIDE1, Flag, 0, 0);
						break;
					case 3:
						SelectSprite(SPRITE_TEE_HATS_SIDE2, Flag, 0, 0);
					}
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}
			}

			// draw feet
			Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_FEET]);
			Graphics()->QuadsBegin();
			CAnimKeyframe *pFoot = f ? pAnim->GetFrontFoot() : pAnim->GetBackFoot();

			float w = BaseSize/2.1f;
			float h = w;

			Graphics()->QuadsSetRotation(pFoot->m_Angle*pi*2);

			if(OutLine)
			{
				Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
				SelectSprite(SPRITE_TEE_FOOT_OUTLINE, 0, 0, 0);
			}
			else
			{
				bool Indicate = !pInfo->m_GotAirJump && m_pConfig->m_ClAirjumpindicator;
				float cs = 1.0f; // color scale
				if(Indicate)
					cs = 0.5f;
				Graphics()->SetColor(pInfo->m_aColors[SKINPART_FEET].r*cs, pInfo->m_aColors[SKINPART_FEET].g*cs, pInfo->m_aColors[SKINPART_FEET].b*cs, pInfo->m_aColors[SKINPART_FEET].a);
				SelectSprite(SPRITE_TEE_FOOT, 0, 0, 0);
			}

			IGraphics::CQuadItem QuadItem(Position.x+pFoot->m_X*AnimScale, Position.y+pFoot->m_Y*AnimScale, w, h);
			Graphics()->QuadsDraw(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}
}